

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O2

FT_Error cff_ps_get_font_info(CFF_Face face,PS_FontInfoRec *afont_info)

{
  CFF_Font_conflict font;
  FT_String *pFVar1;
  FT_String *pFVar2;
  FT_String *pFVar3;
  FT_Long FVar4;
  undefined1 uVar5;
  FT_Short FVar6;
  FT_UShort FVar7;
  undefined2 uVar8;
  uint in_EAX;
  FT_Error FVar9;
  PS_FontInfoRec *pPVar10;
  FT_String *pFVar11;
  ulong uStack_28;
  FT_Error error;
  
  font = (CFF_Font_conflict)(face->extra).data;
  uStack_28 = (ulong)in_EAX;
  if (font == (CFF_Font_conflict)0x0) {
    FVar9 = 0;
  }
  else {
    pPVar10 = font->font_info;
    FVar9 = 0;
    if (pPVar10 == (PS_FontInfoRec *)0x0) {
      pPVar10 = (PS_FontInfoRec *)ft_mem_alloc((face->root).memory,0x38,&error);
      if (error != 0) {
        return error;
      }
      pFVar11 = cff_index_get_sid_string(font,(font->top_font).font_dict.version);
      pPVar10->version = pFVar11;
      pFVar11 = cff_index_get_sid_string(font,(font->top_font).font_dict.notice);
      pPVar10->notice = pFVar11;
      pFVar11 = cff_index_get_sid_string(font,(font->top_font).font_dict.full_name);
      pPVar10->full_name = pFVar11;
      pFVar11 = cff_index_get_sid_string(font,(font->top_font).font_dict.family_name);
      pPVar10->family_name = pFVar11;
      pFVar11 = cff_index_get_sid_string(font,(font->top_font).font_dict.weight);
      pPVar10->weight = pFVar11;
      pPVar10->italic_angle = (font->top_font).font_dict.italic_angle;
      pPVar10->is_fixed_pitch = (font->top_font).font_dict.is_fixed_pitch;
      pPVar10->underline_position = (FT_Short)(font->top_font).font_dict.underline_position;
      pPVar10->underline_thickness = (FT_UShort)(font->top_font).font_dict.underline_thickness;
      font->font_info = pPVar10;
      FVar9 = error;
    }
    uVar5 = pPVar10->field_0x31;
    FVar6 = pPVar10->underline_position;
    FVar7 = pPVar10->underline_thickness;
    uVar8 = *(undefined2 *)&pPVar10->field_0x36;
    afont_info->is_fixed_pitch = pPVar10->is_fixed_pitch;
    afont_info->field_0x31 = uVar5;
    afont_info->underline_position = FVar6;
    afont_info->underline_thickness = FVar7;
    *(undefined2 *)&afont_info->field_0x36 = uVar8;
    pFVar11 = pPVar10->version;
    pFVar1 = pPVar10->notice;
    pFVar2 = pPVar10->full_name;
    pFVar3 = pPVar10->family_name;
    FVar4 = pPVar10->italic_angle;
    afont_info->weight = pPVar10->weight;
    afont_info->italic_angle = FVar4;
    afont_info->full_name = pFVar2;
    afont_info->family_name = pFVar3;
    afont_info->version = pFVar11;
    afont_info->notice = pFVar1;
  }
  return FVar9;
}

Assistant:

static FT_Error
  cff_ps_get_font_info( CFF_Face         face,
                        PS_FontInfoRec*  afont_info )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && !cff->font_info )
    {
      CFF_FontRecDict  dict      = &cff->top_font.font_dict;
      PS_FontInfoRec  *font_info = NULL;
      FT_Memory        memory    = face->root.memory;


      if ( FT_ALLOC( font_info, sizeof ( *font_info ) ) )
        goto Fail;

      font_info->version     = cff_index_get_sid_string( cff,
                                                         dict->version );
      font_info->notice      = cff_index_get_sid_string( cff,
                                                         dict->notice );
      font_info->full_name   = cff_index_get_sid_string( cff,
                                                         dict->full_name );
      font_info->family_name = cff_index_get_sid_string( cff,
                                                         dict->family_name );
      font_info->weight      = cff_index_get_sid_string( cff,
                                                         dict->weight );
      font_info->italic_angle        = dict->italic_angle;
      font_info->is_fixed_pitch      = dict->is_fixed_pitch;
      font_info->underline_position  = (FT_Short)dict->underline_position;
      font_info->underline_thickness = (FT_UShort)dict->underline_thickness;

      cff->font_info = font_info;
    }

    if ( cff )
      *afont_info = *cff->font_info;

  Fail:
    return error;
  }